

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void pugi::impl::anon_unknown_0::node_copy_contents
               (xml_node_struct *dn,xml_node_struct *sn,xml_allocator *shared_alloc)

{
  xml_allocator *in_RDX;
  unsigned_long *in_RSI;
  xml_node_struct *in_RDI;
  uintptr_t unaff_retaddr;
  unsigned_long *in_stack_00000008;
  xml_attribute_struct *da;
  xml_attribute_struct *sa;
  xml_node_struct *in_stack_ffffffffffffffd8;
  unsigned_long local_20;
  xml_node_struct *source;
  
  (anonymous_namespace)::node_copy_string<char*,unsigned_long>
            ((char **)da,in_stack_00000008,unaff_retaddr,(char_t *)in_RDI,in_RSI,in_RDX);
  (anonymous_namespace)::node_copy_string<char*,unsigned_long>
            ((char **)da,in_stack_00000008,unaff_retaddr,(char_t *)in_RDI,in_RSI,in_RDX);
  for (local_20 = in_RSI[7]; local_20 != 0; local_20 = *(unsigned_long *)(local_20 + 0x20)) {
    source = in_RDI;
    get_allocator<pugi::xml_node_struct>(in_RDI);
    in_stack_ffffffffffffffd8 =
         (xml_node_struct *)append_new_attribute(in_stack_ffffffffffffffd8,(xml_allocator *)in_RDI);
    if (in_stack_ffffffffffffffd8 != (xml_node_struct *)0x0) {
      (anonymous_namespace)::node_copy_string<char*,unsigned_long>
                ((char **)da,in_stack_00000008,unaff_retaddr,(char_t *)source,in_RSI,in_RDX);
      (anonymous_namespace)::node_copy_string<char*,unsigned_long>
                ((char **)da,in_stack_00000008,unaff_retaddr,(char_t *)source,in_RSI,in_RDX);
    }
    in_RDI = source;
  }
  return;
}

Assistant:

PUGI_IMPL_FN void node_copy_contents(xml_node_struct* dn, xml_node_struct* sn, xml_allocator* shared_alloc)
	{
		node_copy_string(dn->name, dn->header, xml_memory_page_name_allocated_mask, sn->name, sn->header, shared_alloc);
		node_copy_string(dn->value, dn->header, xml_memory_page_value_allocated_mask, sn->value, sn->header, shared_alloc);

		for (xml_attribute_struct* sa = sn->first_attribute; sa; sa = sa->next_attribute)
		{
			xml_attribute_struct* da = append_new_attribute(dn, get_allocator(dn));

			if (da)
			{
				node_copy_string(da->name, da->header, xml_memory_page_name_allocated_mask, sa->name, sa->header, shared_alloc);
				node_copy_string(da->value, da->header, xml_memory_page_value_allocated_mask, sa->value, sa->header, shared_alloc);
			}
		}
	}